

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O0

void __thiscall
QComboBoxPrivateContainer::resizeEvent(QComboBoxPrivateContainer *this,QResizeEvent *e)

{
  undefined8 uVar1;
  int iVar2;
  QStyle *pQVar3;
  QResizeEvent *in_RSI;
  QStyleOptionComboBox *in_RDI;
  long in_FS_OFFSET;
  QStyleHintReturnMask mask;
  QStyleOption myOpt;
  QStyleOptionComboBox opt;
  QWidget *in_stack_fffffffffffffef8;
  QStyleOptionComboBox *widget;
  QComboBoxPrivateContainer *in_stack_ffffffffffffff18;
  QRegion *in_stack_ffffffffffffff28;
  QWidget *in_stack_ffffffffffffff30;
  undefined1 local_98 [144];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  widget = in_RDI;
  memset(local_98,0xaa,0x90);
  comboStyleOption(in_stack_ffffffffffffff18);
  pQVar3 = QWidget::style(in_stack_fffffffffffffef8);
  uVar1._0_1_ = in_RDI->editable;
  uVar1._1_3_ = *(undefined3 *)&in_RDI->field_0x49;
  uVar1._4_4_ = (in_RDI->popupRect).x1;
  iVar2 = (**(code **)(*(long *)pQVar3 + 0xf0))(pQVar3,0x19,local_98,uVar1,0);
  if (iVar2 == 0) {
    QWidget::clearMask((QWidget *)in_RDI);
  }
  else {
    memset(&stack0xffffffffffffff28,0xaa,0x40);
    QStyleOption::QStyleOption
              ((QStyleOption *)in_stack_ffffffffffffff18,(int)((ulong)widget >> 0x20),(int)widget);
    QStyleOption::initFrom((QStyleOption *)in_stack_ffffffffffffff18,(QWidget *)widget);
    QStyleHintReturnMask::QStyleHintReturnMask((QStyleHintReturnMask *)in_RDI);
    pQVar3 = QWidget::style(in_stack_fffffffffffffef8);
    iVar2 = (**(code **)(*(long *)pQVar3 + 0xf0))
                      (pQVar3,0x50,&stack0xffffffffffffff28,in_RDI,&stack0xffffffffffffff18);
    if (iVar2 != 0) {
      QWidget::setMask(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    }
    QStyleHintReturnMask::~QStyleHintReturnMask((QStyleHintReturnMask *)in_RDI);
    QStyleOption::~QStyleOption((QStyleOption *)in_RDI);
  }
  QWidget::resizeEvent((QWidget *)in_RDI,in_RSI);
  QStyleOptionComboBox::~QStyleOptionComboBox(in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QComboBoxPrivateContainer::resizeEvent(QResizeEvent *e)
{
    QStyleOptionComboBox opt = comboStyleOption();
    if (combo->style()->styleHint(QStyle::SH_ComboBox_Popup, &opt, combo)) {
        QStyleOption myOpt;
        myOpt.initFrom(this);
        QStyleHintReturnMask mask;
        if (combo->style()->styleHint(QStyle::SH_Menu_Mask, &myOpt, this, &mask)) {
            setMask(mask.region);
        }
    } else {
        clearMask();
    }
    QFrame::resizeEvent(e);
}